

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenize.c
# Opt level: O3

int cost_and_tokenize_map
              (Av1ColorMapParam *param,TokenExtra **t,int plane,int calc_rate,int allow_update_cdf,
              FRAME_COUNTS *counts)

{
  aom_cdf_prob *paVar1;
  ushort uVar2;
  ushort uVar3;
  int iVar4;
  int iVar5;
  uint8_t *puVar6;
  MapCdf paaaVar7;
  ColorCost paaiVar8;
  short sVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  byte bVar13;
  uint uVar14;
  int iVar15;
  undefined1 uVar16;
  uint uVar17;
  int iVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  int iVar22;
  ulong uVar23;
  int iVar24;
  ulong uVar25;
  ulong uVar26;
  char local_9a [6];
  int local_94;
  long local_90;
  long local_88;
  long local_80;
  ulong local_78;
  ulong local_70;
  uint8_t color_neighbors [3];
  ulong uStack_68;
  
  local_94 = calc_rate;
  iVar4 = param->rows;
  uVar10 = (iVar4 + param->cols) - 1;
  iVar22 = 0;
  if (1 < (int)uVar10) {
    puVar6 = param->color_map;
    paaaVar7 = param->map_cdf;
    paaiVar8 = param->color_cost;
    iVar5 = param->plane_width;
    local_90 = (long)iVar5;
    uVar17 = param->cols - 1;
    local_88 = (long)param->n_colors;
    local_80 = local_88 + -2;
    uVar14 = param->n_colors - 1;
    uVar23 = 1;
    if (1 < (int)uVar14) {
      uVar23 = (ulong)uVar14;
    }
    uStack_68 = (ulong)uVar17;
    local_78 = (ulong)(int)uVar17;
    local_70 = (ulong)uVar10;
    iVar22 = 0;
    uVar25 = 1;
    do {
      iVar24 = (int)uVar25;
      uVar21 = (ulong)uVar17;
      if (iVar24 < (int)uVar17) {
        uVar21 = uVar25;
      }
      uVar26 = uVar21 & 0xffffffff;
      iVar11 = iVar24 - iVar4;
      if (iVar11 < 0) {
        iVar11 = -1;
      }
      if (iVar11 < (int)uVar21) {
        uVar21 = local_78;
        if ((long)uVar25 < (long)local_78) {
          uVar21 = uVar25;
        }
        do {
          lVar12 = uVar25 - uVar21;
          if ((uVar21 != 0) == (lVar12 != 0 && (long)uVar21 <= (long)uVar25)) {
            bVar13 = puVar6[(uVar21 - 1) + lVar12 * local_90];
            local_9a[3] = bVar13;
            lVar19 = (lVar12 + -1) * local_90;
            local_9a[4] = puVar6[uVar21 + lVar19];
            local_9a[5] = puVar6[(uVar21 - 1) + lVar19];
            local_9a[2] = 1;
            local_9a[0] = '\x02';
            local_9a[1] = '\x02';
            if (bVar13 == local_9a[4]) {
              local_9a[4] = 0xff;
              if (bVar13 == local_9a[5]) {
                local_9a[0] = '\x05';
                local_9a[1] = '\x02';
                lVar19 = 1;
              }
              else {
                local_9a[0] = '\x04';
                local_9a[1] = '\x01';
                local_9a[4] = local_9a[5];
                lVar19 = 2;
              }
            }
            else if (bVar13 == local_9a[5]) {
              local_9a[0] = '\x03';
              local_9a[1] = '\x02';
              lVar19 = 2;
LAB_0023032c:
              if (local_9a[4] == 0xff) {
LAB_00230352:
                local_9a[1] = 1;
                local_9a[4] = local_9a[5];
              }
              else if (((byte)local_9a[4] < bVar13) && (uVar16 = 2, bVar13 != local_9a[5]))
              goto LAB_0023033e;
            }
            else {
              lVar19 = 3;
              if (local_9a[4] != local_9a[5]) goto LAB_0023032c;
              uVar16 = 3;
              lVar19 = 2;
              if (local_9a[4] == 0xff) goto LAB_00230352;
LAB_0023033e:
              local_9a[3] = local_9a[4];
              local_9a[1] = 2;
              local_9a[0] = uVar16;
              local_9a[4] = bVar13;
            }
            bVar13 = puVar6[uVar21 + lVar12 * local_90];
            uVar14 = (uint)bVar13;
            lVar12 = 0;
            do {
              if (bVar13 < (byte)local_9a[lVar12 + 3]) {
                uVar14 = uVar14 + 1;
              }
              else if (local_9a[lVar12 + 3] == bVar13) {
                uVar14 = (uint)lVar12;
                break;
              }
              lVar12 = lVar12 + 1;
            } while (lVar19 != lVar12);
            lVar12 = 0;
            bVar13 = 0;
            do {
              bVar13 = bVar13 + (&av1_fast_palette_color_index_context_hash_multipliers)[lVar12] *
                                local_9a[lVar12];
              lVar12 = lVar12 + 1;
            } while (lVar19 != lVar12);
            iVar15 = 9 - (uint)bVar13;
          }
          else {
            iVar15 = iVar24 - (int)uVar26;
            if (lVar12 < 1) {
              iVar18 = (int)uVar21 + iVar15 * iVar5 + -1;
              iVar15 = (int)lVar12;
            }
            else {
              iVar18 = (int)uVar21 + (iVar15 + -1) * iVar5;
            }
            bVar13 = puVar6[(long)(iVar15 * iVar5) + uVar21];
            uVar14 = (uint)bVar13;
            if (bVar13 < puVar6[iVar18]) {
              uVar14 = uVar14 + 1;
              iVar15 = 0;
            }
            else {
              iVar15 = 0;
              if (puVar6[iVar18] == bVar13) {
                uVar14 = 0;
              }
            }
          }
          if (plane == 0) {
            **t = (TokenExtra)((byte)**t & 0xf8 | (byte)uVar14 & 7);
            **t = (TokenExtra)((byte)**t & 0xf | (char)iVar15 << 4);
            *t = *t + 1;
            if (calc_rate != 0) {
              uVar2 = paaaVar7[local_80][iVar15][local_88];
              bVar13 = (char)(uVar2 >> 4) + (3 < local_88) + 4;
              uVar20 = 0;
              do {
                uVar3 = paaaVar7[local_80][iVar15][uVar20];
                if ((long)uVar20 < (long)(char)(byte)uVar14) {
                  sVar9 = (short)((int)(0x8000 - (uint)uVar3) >> (bVar13 & 0x1f));
                }
                else {
                  sVar9 = -(uVar3 >> (bVar13 & 0x1f));
                }
                paaaVar7[local_80][iVar15][uVar20] = sVar9 + uVar3;
                uVar20 = uVar20 + 1;
              } while (uVar23 != uVar20);
              paVar1 = paaaVar7[local_80][iVar15] + local_88;
              *paVar1 = *paVar1 + (ushort)(uVar2 < 0x20);
            }
          }
          else {
            iVar22 = iVar22 + paaiVar8[local_80][iVar15][(int)uVar14];
          }
          uVar21 = uVar21 - 1;
          uVar26 = (ulong)((int)uVar26 - 1);
        } while ((long)iVar11 < (long)uVar21);
      }
      uVar25 = uVar25 + 1;
    } while (uVar25 != uVar10);
  }
  if (plane == 0) {
    iVar22 = 0;
  }
  return iVar22;
}

Assistant:

static int cost_and_tokenize_map(Av1ColorMapParam *param, TokenExtra **t,
                                 int plane, int calc_rate, int allow_update_cdf,
                                 FRAME_COUNTS *counts) {
  const uint8_t *const color_map = param->color_map;
  MapCdf map_cdf = param->map_cdf;
  ColorCost color_cost = param->color_cost;
  const int plane_block_width = param->plane_width;
  const int rows = param->rows;
  const int cols = param->cols;
  const int n = param->n_colors;
  const int palette_size_idx = n - PALETTE_MIN_SIZE;
  int this_rate = 0;

  (void)plane;
  (void)counts;

  for (int k = 1; k < rows + cols - 1; ++k) {
    for (int j = AOMMIN(k, cols - 1); j >= AOMMAX(0, k - rows + 1); --j) {
      int i = k - j;
      int color_new_idx;
      const int color_ctx = av1_fast_palette_color_index_context(
          color_map, plane_block_width, i, j, &color_new_idx);
      assert(color_new_idx >= 0 && color_new_idx < n);
      if (calc_rate) {
        this_rate += color_cost[palette_size_idx][color_ctx][color_new_idx];
      } else {
        (*t)->token = color_new_idx;
        (*t)->color_ctx = color_ctx;
        ++(*t);
        if (allow_update_cdf)
          update_cdf(map_cdf[palette_size_idx][color_ctx], color_new_idx, n);
#if CONFIG_ENTROPY_STATS
        if (plane) {
          ++counts->palette_uv_color_index[palette_size_idx][color_ctx]
                                          [color_new_idx];
        } else {
          ++counts->palette_y_color_index[palette_size_idx][color_ctx]
                                         [color_new_idx];
        }
#endif
      }
    }
  }
  if (calc_rate) return this_rate;
  return 0;
}